

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Disk::writeTo(Disk *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::write<float>(binary,&this->radius);
  BinaryWriter::write<float>(binary,&this->height);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->transform);
  return 0x35;
}

Assistant:

int Disk::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(radius);
    binary.write(height);
    binary.write(transform);
    return TYPE_DISK;
  }